

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

mg_connection *
mg_connect_client_impl
          (mg_client_options *client_options,int use_ssl,mg_init_data *init,mg_error_data *error)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  mg_connection *conn;
  int *piVar6;
  char *pcVar7;
  char *pcVar8;
  size_t len_00;
  uint line;
  char **ppcVar9;
  socklen_t __len;
  mg_context *ctx;
  char *func;
  mg_context *ctx_00;
  char *pcVar10;
  socklen_t len_1;
  usa sa;
  socklen_t len;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar11;
  int local_6c;
  char *local_68;
  int local_60;
  socklen_t local_5c;
  sockaddr local_58;
  undefined4 uStack_48;
  undefined8 uStack_44;
  undefined4 local_3c;
  pollfd local_38;
  
  uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  conn = (mg_connection *)calloc(1,0x2cf90);
  if (init == (mg_init_data *)0x0) {
    if (conn == (mg_connection *)0x0) {
      return (mg_connection *)0x0;
    }
  }
  else {
    init->callbacks = (mg_callbacks *)0x0;
    if (init->configuration_options != (char **)0x0) {
      *(undefined1 *)init->user_data = 0;
    }
    if (conn == (mg_connection *)0x0) {
      init->callbacks = (mg_callbacks *)0x2cf9000000006;
      pcVar8 = (char *)init->user_data;
      ppcVar9 = init->configuration_options;
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar8,(size_t)ppcVar9,"calloc(): %s",pcVar7);
      return (mg_connection *)0x0;
    }
  }
  conn->phys_ctx = (mg_context *)(conn + 1);
  conn->buf = (char *)&conn[0x42].request_info.http_headers[0x11].value;
  conn->buf_size = 0x4000;
  conn[1].connection_type = 2;
  conn->dom_ctx = (mg_domain_context *)&conn[0x41].last_throttle_time;
  pcVar8 = client_options->host;
  iVar5 = client_options->port;
  local_58.sa_family = 0;
  local_58.sa_data[0] = '\0';
  local_58.sa_data[1] = '\0';
  local_58.sa_data[2] = '\0';
  local_58.sa_data[3] = '\0';
  local_58.sa_data[4] = '\0';
  local_58.sa_data[5] = '\0';
  local_58.sa_data[6] = '\0';
  local_58.sa_data[7] = '\0';
  local_58.sa_data[8] = '\0';
  local_58.sa_data[9] = '\0';
  local_58.sa_data[10] = '\0';
  local_58.sa_data[0xb] = '\0';
  local_58.sa_data[0xc] = '\0';
  local_58.sa_data[0xd] = '\0';
  uStack_48 = 0;
  uStack_44 = 0;
  local_60 = use_ssl;
  if (pcVar8 == (char *)0x0) {
    if (init == (mg_init_data *)0x0) goto LAB_0011351e;
    *(undefined4 *)&init->callbacks = 1;
    pcVar8 = (char *)init->user_data;
    ppcVar9 = init->configuration_options;
    pcVar7 = "NULL host";
LAB_00113162:
    pcVar10 = "%s";
  }
  else {
    if (iVar5 - 0x10000U < 0xffff0001) {
      if (init == (mg_init_data *)0x0) goto LAB_0011351e;
      *(undefined4 *)&init->callbacks = 1;
      pcVar8 = (char *)init->user_data;
      ppcVar9 = init->configuration_options;
      pcVar7 = "invalid port";
      goto LAB_00113162;
    }
    iVar4 = 2;
    line = 0x10;
    iVar2 = mg_inet_pton(2,pcVar8,&local_58,0x10,1);
    uVar1 = (ushort)iVar5;
    if (iVar2 == 0) {
      iVar4 = 10;
      line = 0x1c;
      iVar3 = mg_inet_pton(10,pcVar8,&local_58,0x1c,1);
      if (iVar3 != 0) goto LAB_001131c8;
      if (*pcVar8 != '[') {
LAB_00113544:
        if (init == (mg_init_data *)0x0) goto LAB_0011351e;
        *(undefined4 *)&init->callbacks = 0xf;
        pcVar8 = (char *)init->user_data;
        ppcVar9 = init->configuration_options;
        pcVar7 = "host not found";
        goto LAB_00113162;
      }
      pcVar7 = pcVar8 + 1;
      pcVar10 = (char *)strlen(pcVar7);
      if (pcVar10 < (char *)0x2) goto LAB_00113544;
      local_68 = pcVar10;
      len_00 = strlen(pcVar7);
      pcVar7 = mg_strndup_ctx(pcVar7,len_00,ctx_00);
      if (pcVar7 == (char *)0x0) goto LAB_00113544;
      (pcVar7 + -1)[(long)local_68] = '\0';
      iVar4 = 10;
      line = 0x1c;
      local_68 = pcVar7;
      iVar3 = mg_inet_pton(10,pcVar7,&local_58,0x1c,0);
      if (iVar3 == 0) {
        free(local_68);
        goto LAB_00113544;
      }
      local_58.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
      free(local_68);
    }
    else {
LAB_001131c8:
      local_58.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
    }
    iVar4 = socket(iVar4,1,0);
    if (iVar4 != -1) {
      iVar3 = set_non_blocking_mode(iVar4);
      if (iVar3 == 0) {
        set_close_on_exec(iVar4,conn + 1,ctx);
        iVar3 = 0x1c;
        __len = 0x10;
        if (iVar2 == 0) {
          __len = 0x1c;
        }
        iVar2 = connect(iVar4,&local_58,__len);
        if (iVar2 == 0) {
LAB_00113343:
          if (local_58.sa_family == 2) {
            iVar3 = 0x10;
          }
          (conn->client).sock = iVar4;
          *(undefined8 *)&(conn->client).lsa = local_58._0_8_;
          *(ulong *)((long)&(conn->client).lsa + 8) =
               CONCAT44(local_58.sa_data._10_4_,local_58.sa_data._6_4_);
          *(ulong *)((long)&(conn->client).lsa + 0xc) = CONCAT44(uStack_48,local_58.sa_data._10_4_);
          *(undefined8 *)((long)&(conn->client).lsa + 0x14) = uStack_44;
          local_38.fd = iVar3;
          iVar5 = getsockname(iVar4,(sockaddr *)&(conn->client).rsa.sa,(socklen_t *)&local_38);
          if (iVar5 != 0) {
            piVar6 = __errno_location();
            pcVar8 = strerror(*piVar6);
            mg_cry_internal_wrap
                      (conn,(mg_context *)0x0,func,line,"%s: getsockname() failed: %s",
                       "mg_connect_client_impl",pcVar8);
          }
          (conn->client).is_ssl = local_60 != 0;
          iVar5 = pthread_mutex_init((pthread_mutex_t *)&conn->mutex,
                                     (pthread_mutexattr_t *)&pthread_mutex_attr);
          if (iVar5 == 0) {
            return conn;
          }
          if (init != (mg_init_data *)0x0) {
            *(undefined4 *)&init->callbacks = 9;
            piVar6 = __errno_location();
            *(int *)((long)&init->callbacks + 4) = *piVar6;
            mg_snprintf((mg_connection *)0x0,(int *)0x0,(char *)init->user_data,
                        (size_t)init->configuration_options,"Can not create mutex");
          }
        }
        else {
          piVar6 = __errno_location();
          local_6c = *piVar6;
          if (local_6c == 0x73) {
            local_5c = 4;
            local_3c = 0;
            local_38.events = 4;
            local_38.fd = iVar4;
            iVar2 = mg_poll(&local_38,1,10000,(stop_flag_t *)&conn[1].request_info.local_uri);
            if (iVar2 == 1) {
              iVar2 = getsockopt(iVar4,1,4,&local_6c,&local_5c);
              line = (uint)&local_6c;
              if (iVar2 == 0 && local_6c == 0) goto LAB_00113343;
              goto LAB_001134ae;
            }
            if (init == (mg_init_data *)0x0) goto LAB_00113519;
            *(undefined4 *)&init->callbacks = 0x10;
            pcVar7 = (char *)init->user_data;
            ppcVar9 = init->configuration_options;
            pcVar10 = "connect(%s:%d): timeout";
          }
          else {
LAB_001134ae:
            if (init == (mg_init_data *)0x0) goto LAB_00113519;
            *(undefined4 *)&init->callbacks = 0x11;
            *(int *)((long)&init->callbacks + 4) = *piVar6;
            pcVar7 = (char *)init->user_data;
            ppcVar9 = init->configuration_options;
            strerror(local_6c);
            pcVar10 = "connect(%s:%d): error %s";
          }
          mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar7,(size_t)ppcVar9,pcVar10,pcVar8,
                      CONCAT44(uVar11,iVar5));
        }
      }
      else if (init != (mg_init_data *)0x0) {
        *(undefined4 *)&init->callbacks = 9;
        piVar6 = __errno_location();
        iVar5 = *piVar6;
        *(int *)((long)&init->callbacks + 4) = iVar5;
        pcVar8 = (char *)init->user_data;
        ppcVar9 = init->configuration_options;
        pcVar7 = strerror(iVar5);
        mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar8,(size_t)ppcVar9,
                    "Cannot set socket to non-blocking: %s",pcVar7);
      }
LAB_00113519:
      close(iVar4);
      goto LAB_0011351e;
    }
    if (init == (mg_init_data *)0x0) goto LAB_0011351e;
    *(undefined4 *)&init->callbacks = 9;
    piVar6 = __errno_location();
    iVar5 = *piVar6;
    *(int *)((long)&init->callbacks + 4) = iVar5;
    pcVar8 = (char *)init->user_data;
    ppcVar9 = init->configuration_options;
    pcVar7 = strerror(iVar5);
    pcVar10 = "socket(): %s";
  }
  mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar8,(size_t)ppcVar9,pcVar10,pcVar7);
LAB_0011351e:
  free(conn);
  return (mg_connection *)0x0;
}

Assistant:

static struct mg_connection *
mg_connect_client_impl(const struct mg_client_options *client_options,
                       int use_ssl,
                       struct mg_init_data *init,
                       struct mg_error_data *error)
{
	struct mg_connection *conn = NULL;
	SOCKET sock;
	union usa sa;
	struct sockaddr *psa;
	socklen_t len;

	unsigned max_req_size =
	    (unsigned)atoi(config_options[MAX_REQUEST_SIZE].default_value);

	/* Size of structures, aligned to 8 bytes */
	size_t conn_size = ((sizeof(struct mg_connection) + 7) >> 3) << 3;
	size_t ctx_size = ((sizeof(struct mg_context) + 7) >> 3) << 3;
	size_t alloc_size = conn_size + ctx_size + max_req_size;

	(void)init; /* TODO: Implement required options */

	conn = (struct mg_connection *)mg_calloc(1, alloc_size);

	if (error != NULL) {
		error->code = MG_ERROR_DATA_CODE_OK;
		error->code_sub = 0;
		if (error->text_buffer_size > 0) {
			error->text[0] = 0;
		}
	}

	if (conn == NULL) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)alloc_size;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for ebuf */
			            error->text,
			            error->text_buffer_size,
			            "calloc(): %s",
			            strerror(ERRNO));
		}
		return NULL;
	}

#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wcast-align"
#endif /* defined(GCC_DIAGNOSTIC) */
	/* conn_size is aligned to 8 bytes */

	conn->phys_ctx = (struct mg_context *)(((char *)conn) + conn_size);

#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic pop
#endif /* defined(GCC_DIAGNOSTIC) */

	conn->buf = (((char *)conn) + conn_size + ctx_size);
	conn->buf_size = (int)max_req_size;
	conn->phys_ctx->context_type = CONTEXT_HTTP_CLIENT;
	conn->dom_ctx = &(conn->phys_ctx->dd);

	if (!connect_socket(conn->phys_ctx,
	                    client_options->host,
	                    client_options->port,
	                    use_ssl,
	                    error,
	                    &sock,
	                    &sa)) {
		/* "error" will be set by connect_socket. */
		/* free all memory and return NULL; */
		mg_free(conn);
		return NULL;
	}

#if !defined(NO_SSL) && !defined(USE_MBEDTLS) // TODO: mbedTLS client
#if (defined(OPENSSL_API_1_1) || defined(OPENSSL_API_3_0))                     \
    && !defined(NO_SSL_DL)

	if (use_ssl
	    && (conn->dom_ctx->ssl_ctx = SSL_CTX_new(TLS_client_method()))
	           == NULL) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for ebuf */
			            error->text,
			            error->text_buffer_size,
			            "SSL_CTX_new error: %s",
			            ssl_error());
		}

		closesocket(sock);
		mg_free(conn);
		return NULL;
	}

#else

	if (use_ssl
	    && (conn->dom_ctx->ssl_ctx = SSL_CTX_new(SSLv23_client_method()))
	           == NULL) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for ebuf */
			            error->text,
			            error->text_buffer_size,
			            "SSL_CTX_new error: %s",
			            ssl_error());
		}

		closesocket(sock);
		mg_free(conn);
		return NULL;
	}

#endif /* OPENSSL_API_1_1 || OPENSSL_API_3_0 */
#endif /* NO_SSL */

#if defined(USE_IPV6)
	len = (sa.sa.sa_family == AF_INET) ? sizeof(conn->client.rsa.sin)
	                                   : sizeof(conn->client.rsa.sin6);
	psa = (sa.sa.sa_family == AF_INET)
	          ? (struct sockaddr *)&(conn->client.rsa.sin)
	          : (struct sockaddr *)&(conn->client.rsa.sin6);
#else
	len = sizeof(conn->client.rsa.sin);
	psa = (struct sockaddr *)&(conn->client.rsa.sin);
#endif

	conn->client.sock = sock;
	conn->client.lsa = sa;

	if (getsockname(sock, psa, &len) != 0) {
		mg_cry_internal(conn,
		                "%s: getsockname() failed: %s",
		                __func__,
		                strerror(ERRNO));
	}

	conn->client.is_ssl = use_ssl ? 1 : 0;
	if (0 != pthread_mutex_init(&conn->mutex, &pthread_mutex_attr)) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OS_ERROR;
			error->code_sub = (unsigned)ERRNO;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for ebuf */
			            error->text,
			            error->text_buffer_size,
			            "Can not create mutex");
		}
#if !defined(NO_SSL) && !defined(USE_MBEDTLS) // TODO: mbedTLS client
		SSL_CTX_free(conn->dom_ctx->ssl_ctx);
#endif
		closesocket(sock);
		mg_free(conn);
		return NULL;
	}

#if !defined(NO_SSL) && !defined(USE_MBEDTLS) // TODO: mbedTLS client
	if (use_ssl) {
		/* TODO: Check ssl_verify_peer and ssl_ca_path here.
		 * SSL_CTX_set_verify call is needed to switch off server
		 * certificate checking, which is off by default in OpenSSL and
		 * on in yaSSL. */
		/* TODO: SSL_CTX_set_verify(conn->dom_ctx,
		 * SSL_VERIFY_PEER, verify_ssl_server); */

		if (client_options->client_cert) {
			if (!ssl_use_pem_file(conn->phys_ctx,
			                      conn->dom_ctx,
			                      client_options->client_cert,
			                      NULL)) {
				if (error != NULL) {
					error->code = MG_ERROR_DATA_CODE_TLS_CLIENT_CERT_ERROR;
					mg_snprintf(NULL,
					            NULL, /* No truncation check for ebuf */
					            error->text,
					            error->text_buffer_size,
					            "Can not use SSL client certificate");
				}

				SSL_CTX_free(conn->dom_ctx->ssl_ctx);
				closesocket(sock);
				mg_free(conn);
				return NULL;
			}
		}

		if (client_options->server_cert) {
			if (SSL_CTX_load_verify_locations(conn->dom_ctx->ssl_ctx,
			                                  client_options->server_cert,
			                                  NULL)
			    != 1) {
				if (error != NULL) {
					error->code = MG_ERROR_DATA_CODE_TLS_SERVER_CERT_ERROR;
					mg_snprintf(NULL,
					            NULL, /* No truncation check for ebuf */
					            error->text,
					            error->text_buffer_size,
					            "SSL_CTX_load_verify_locations error: %s",
					            ssl_error());
				}
				SSL_CTX_free(conn->dom_ctx->ssl_ctx);
				closesocket(sock);
				mg_free(conn);
				return NULL;
			}
			SSL_CTX_set_verify(conn->dom_ctx->ssl_ctx, SSL_VERIFY_PEER, NULL);
		} else {
			SSL_CTX_set_verify(conn->dom_ctx->ssl_ctx, SSL_VERIFY_NONE, NULL);
		}

		if (!sslize(conn, SSL_connect, client_options)) {
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_TLS_CONNECT_ERROR;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for ebuf */
				            error->text,
				            error->text_buffer_size,
				            "SSL connection error");
			}
			SSL_CTX_free(conn->dom_ctx->ssl_ctx);
			closesocket(sock);
			mg_free(conn);
			return NULL;
		}
	}
#endif

	return conn;
}